

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioCtl.cc
# Opt level: O1

bool __thiscall AudioCtl::key(AudioCtl *this,AKey key,bool pressed)

{
  int iVar1;
  ulong uVar2;
  bool bVar3;
  undefined7 in_register_00000011;
  int iVar4;
  
  bVar3 = false;
  if ((int)CONCAT71(in_register_00000011,pressed) == 0) {
    return false;
  }
  switch(key) {
  case AK_Space:
    this->paused_ = (bool)(this->paused_ ^ 1);
    goto LAB_0010b1ec;
  case AK_PageUp:
  case AK_PageDown:
  case 0x23:
  case 0x24:
    goto switchD_0010b16d_caseD_21;
  case AK_Left:
    iVar4 = -this->settings_->pattern_length;
    break;
  case AK_Up:
    iVar4 = this->settings_->pattern_length << 2;
    break;
  case AK_Right:
    iVar4 = this->settings_->pattern_length;
    break;
  case AK_Down:
    iVar4 = this->settings_->pattern_length * -4;
    break;
  default:
    if (key != AK_M) {
      if (key != AK_Z) {
        return false;
      }
      iVar4 = this->set_;
      if (iVar4 == 2) {
        this->start_ = 0;
        this->end_ = this->settings_->samples;
        this->set_ = 0;
        return true;
      }
      if (iVar4 == 1) {
        iVar4 = this->settings_->samples_per_row;
        iVar1 = this->settings_->pattern_length;
        this->end_ = iVar1 * iVar4 *
                     (((this->pos_).super___atomic_base<int>._M_i / iVar4 + iVar1 + -1) / iVar1);
        this->set_ = 2;
        return true;
      }
      if (iVar4 != 0) {
        return true;
      }
      iVar4 = this->settings_->samples_per_row;
      iVar1 = this->settings_->pattern_length;
      uVar2 = (long)(this->pos_).super___atomic_base<int>._M_i / (long)iVar4;
      this->start_ = iVar1 * iVar4 *
                     (int)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) /
                          (long)iVar1);
      this->set_ = 1;
      return true;
    }
    this->muted_ = (bool)(this->muted_ ^ 1);
    goto LAB_0010b1ec;
  }
  timeShift(this,iVar4);
LAB_0010b1ec:
  bVar3 = true;
switchD_0010b16d_caseD_21:
  return bVar3;
}

Assistant:

bool AudioCtl::key(AKey key, bool pressed) noexcept {
	if (!pressed)
		return false;

	switch (key) {
	case AK_Left:
		timeShift(-settings_.pattern_length);
		break;
	case AK_Right:
		timeShift(settings_.pattern_length);
		break;
	case AK_Up:
		timeShift(4*settings_.pattern_length);
		break;
	case AK_Down:
		timeShift(-4*settings_.pattern_length);
		break;

	case AK_M:
		muted_ = !muted_;
		break;

	case AK_Space:
		paused_ ^= 1;
		break;

	case AK_Z:
		switch (set_) {
		case 0:
			start_ = ((pos_ / settings_.samples_per_row) / settings_.pattern_length) * settings_.samples_per_row * settings_.pattern_length;
			set_ = 1;
			break;
		case 1:
			end_ = (((pos_ / settings_.samples_per_row) + (settings_.pattern_length-1)) / settings_.pattern_length) * settings_.samples_per_row * settings_.pattern_length;
			set_ = 2;
			break;
		case 2:
			start_ = 0;
			end_ = settings_.samples;
			set_ = 0;
		}
		break;
	default:
		return false;
	}

	return true;
}